

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O1

NetInterface * FS::operator<<(NetInterface *sink,StateArg sA)

{
  anon_union_4_2_4170921f_for_StateArg_2 i;
  
  if (sA.type == INT) {
    i = sA.field_1;
    if ((long)sA < 0) {
      (*sink->_vptr_NetInterface[4])(sink,"-",1);
      i.intArg = -i.intArg;
    }
    ::operator<<(sink,i.dirArg);
  }
  else {
    if (sA.type != NONE) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/glowmouse[P]beefocus/firmware/focuser_state.h"
                    ,0x1d8,"T &FS::operator<<(T &, StateArg) [T = NetInterface]");
    }
    (*sink->_vptr_NetInterface[4])(sink,"NoArg",5);
  }
  return sink;
}

Assistant:

T& operator<<( T& sink, StateArg sA )
{
  switch (sA.getType() )
  {
    case StateArg::Type::NONE:
      sink << "NoArg";
      break;
    case StateArg::Type::INT:
      sink << sA.getInt();
      break;
    default:
      assert(0);
  }
  return sink; 
}